

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<wasm::HeapType> *
wasm::WATParser::anon_unknown_11::
typeidx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
          (Result<wasm::HeapType> *__return_storage_ptr__,ParseImplicitTypeDefsCtx *ctx)

{
  ParseInput *this;
  pointer pHVar1;
  optional<unsigned_int> oVar2;
  const_iterator cVar3;
  key_type local_110;
  undefined1 auStack_100 [8];
  optional<wasm::Name> id;
  string local_c8;
  undefined1 local_a8 [8];
  MaybeResult<unsigned_int> idx;
  Result<unsigned_int> _val;
  Result<unsigned_int> idx_1;
  
  this = &ctx->in;
  oVar2 = ParseInput::takeU32(this);
  if (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    ParseInput::takeID((optional<wasm::Name> *)auStack_100,this);
    if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01') {
      local_110.super_IString.str._M_len = (size_t)auStack_100;
      local_110.super_IString.str._M_str =
           (char *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len;
      cVar3 = std::
              _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&((ctx->
                       super_TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseImplicitTypeDefsCtx>
                       ).typeIndices)->_M_h,&local_110);
      if (cVar3.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur ==
          (__node_type *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"unknown type identifier",
                   (allocator<char> *)
                   ((long)&idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x27));
        ParseInput::err((Err *)((long)&idx.val.
                                       super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                               + 0x20),this,&local_c8);
        std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::WATParser::Err>::
        _Variant_storage<1ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,unsigned_int,wasm::WATParser::Err> *)
                   ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20),
                   (__index_type *)
                   ((long)&idx.val.
                           super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&idx.val.
                           super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20));
        std::__cxx11::string::~string((string *)&local_c8);
      }
      else {
        _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_4_ =
             *(undefined4 *)
              ((long)cVar3.
                     super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>.
                     _M_cur + 0x18);
        idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._24_1_ = 0;
      }
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_unsigned_int,_wasm::WATParser::Err> *)
                      ((long)&idx.val.
                              super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                      + 0x20),(_Copy_ctor_base<false,_unsigned_int,_wasm::WATParser::Err> *)
                              ((long)&_val.val.
                                      super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                      super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                      super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                      super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                      super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> +
                              0x20));
      if (_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)&local_c8,
                   (string *)
                   ((long)&idx.val.
                           super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20));
        std::__detail::__variant::
        _Variant_storage<false,unsigned_int,wasm::WATParser::None,wasm::WATParser::Err>::
        _Variant_storage<2ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,unsigned_int,wasm::WATParser::None,wasm::WATParser::Err>
                    *)local_a8,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::Err> *)
                          ((long)&idx.val.
                                  super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                          + 0x20));
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::Err> *)
                          ((long)&idx.val.
                                  super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                          + 0x20));
        local_a8._0_4_ =
             _val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._32_4_;
        idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u
        ._24_1_ = 0;
      }
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::Err> *)
                        ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20));
      if (idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
          _M_u._24_1_ != '\x01') goto LAB_00a7cdc0;
    }
    else {
      idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u.
      _24_1_ = 1;
    }
    std::__detail::__variant::
    _Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged,
               "expected type index or identifier",
               (allocator<char> *)
               ((long)&idx.val.
                       super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
               + 0x20));
    ParseInput::err((Err *)((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20
                           ),this,
                    (string *)
                    &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__detail::__variant::_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err>::
    _Variant_storage<1ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err> *)__return_storage_ptr__
               ,(__index_type *)
                ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
  }
  else {
    local_a8._0_4_ =
         oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload;
    idx.val.super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u.
    _24_1_ = 0;
LAB_00a7cdc0:
    std::__detail::__variant::
    _Copy_ctor_base<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                     *)((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                               super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20),
                    (_Copy_ctor_base<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                     *)local_a8);
    if (idx_1.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::WATParser::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&idx.val.
                         super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20),(string *)
                         ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                 super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                 super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20))
      ;
      std::__detail::__variant::_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err>::
      _Variant_storage<1ul,wasm::WATParser::Err>
                ((_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err> *)
                 __return_storage_ptr__,
                 (__index_type *)
                 ((long)&idx.val.
                         super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&idx.val.
                         super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20));
      std::__detail::__variant::
      _Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20
                           ));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20
                           ));
      pHVar1 = (ctx->types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(uint)local_a8._0_4_ <
          (ulong)((long)(ctx->types->
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
                        .super__Vector_impl_data._M_finish - (long)pHVar1 >> 3)) {
        *(uintptr_t *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> =
             pHVar1[(uint)local_a8._0_4_].id;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20) = '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&idx.val.
                           super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20),"type index out of bounds",(allocator<char> *)&local_c8);
        ParseInput::err((Err *)((long)&_val.val.
                                       super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                                       super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                       super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                                       super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                                       super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> +
                               0x20),this,
                        (string *)
                        ((long)&idx.val.
                                super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                        + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err>::
        _Variant_storage<1ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::HeapType,wasm::WATParser::Err> *)
                   __return_storage_ptr__,
                   (__index_type *)
                   ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::WATParser::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&idx.val.
                           super__Variant_base<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20));
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> typeidx(Ctx& ctx) {
  if (auto idx = maybeTypeidx(ctx)) {
    CHECK_ERR(idx);
    return ctx.getHeapTypeFromIdx(*idx);
  }
  return ctx.in.err("expected type index or identifier");
}